

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::Server::apply_ranges
          (Server *this,Request *req,Response *res,string *content_type,string *boundary)

{
  bool bVar1;
  EncodingType EVar2;
  uint uVar3;
  size_type sVar4;
  pointer ppVar5;
  ulong uVar6;
  size_t sVar7;
  pointer pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  unsigned_long __val;
  string *content_length;
  pair<unsigned_long,_unsigned_long> pVar11;
  allocator local_419;
  string local_418;
  undefined1 local_3f8 [8];
  string length_1;
  string local_3d0;
  anon_class_8_1_8772f13f local_3b0;
  function<bool_(const_char_*,_unsigned_long)> local_3a8;
  undefined1 local_388 [8];
  string compressed;
  string content_encoding;
  unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
  compressor;
  string data;
  allocator local_2f9;
  string local_2f8;
  undefined1 local_2d8 [8];
  string content_range_1;
  unsigned_long length_2;
  unsigned_long offset_1;
  pair<unsigned_long,_unsigned_long> offsets_1;
  string local_290;
  allocator local_269;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  undefined1 local_138 [8];
  string content_range;
  unsigned_long offset;
  pair<unsigned_long,_unsigned_long> offsets;
  size_t length;
  undefined1 local_f0 [4];
  EncodingType type;
  allocator local_c9;
  string local_c8;
  _Base_ptr local_a8;
  _Base_ptr local_a0;
  _Self local_98 [3];
  allocator local_79;
  key_type local_78;
  _Self local_58;
  iterator it;
  string *boundary_local;
  string *content_type_local;
  Response *res_local;
  Request *req_local;
  Server *this_local;
  
  content_length = boundary;
  sVar4 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                    (&req->ranges);
  if (1 < sVar4) {
    detail::make_multipart_data_boundary_abi_cxx11_();
    std::__cxx11::string::operator=((string *)boundary,(string *)&it);
    std::__cxx11::string::~string((string *)&it);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"Content-Type",&local_79);
    local_58._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&res->headers,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    local_98[0]._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&res->headers);
    bVar1 = std::operator!=(&local_58,local_98);
    if (bVar1) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_58);
      std::__cxx11::string::operator=((string *)content_type,(string *)&ppVar5->second);
      local_a0 = local_58._M_node;
      local_a8 = (_Base_ptr)
                 std::
                 multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 ::erase_abi_cxx11_((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                     *)&res->headers,local_58._M_node);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"Content-Type",&local_c9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   "multipart/byteranges; boundary=",boundary);
    Response::set_header(res,&local_c8,(string *)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  EVar2 = detail::encoding_type(req,res);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    bVar1 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::empty
                      (&req->ranges);
    if (!bVar1) {
      sVar4 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                        (&req->ranges);
      if (sVar4 == 1) {
        sVar7 = std::__cxx11::string::size();
        pVar11 = detail::get_range_offset_and_length(req,sVar7,0);
        offset_1 = pVar11.first;
        offsets_1.first = pVar11.second;
        content_range_1.field_2._8_8_ = offsets_1.first;
        sVar7 = std::__cxx11::string::size();
        detail::make_content_range_header_field_abi_cxx11_
                  ((string *)local_2d8,(detail *)offset_1,offsets_1.first,sVar7,
                   (size_t)content_length);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2f8,"Content-Range",&local_2f9);
        Response::set_header(res,&local_2f8,(string *)local_2d8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
        uVar6 = std::__cxx11::string::size();
        if (offset_1 < uVar6) {
          std::__cxx11::string::substr((ulong)((long)&data.field_2 + 8),(ulong)&res->body);
          std::__cxx11::string::operator=
                    ((string *)&res->body,(string *)(data.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(data.field_2._M_local_buf + 8));
        }
        else {
          std::__cxx11::string::clear();
          res->status = 0x1a0;
        }
        std::__cxx11::string::~string((string *)local_2d8);
      }
      else {
        std::__cxx11::string::string((string *)&compressor);
        bVar1 = detail::make_multipart_ranges_data
                          (req,res,boundary,content_type,(string *)&compressor);
        if (bVar1) {
          std::__cxx11::string::swap((string *)&res->body);
        }
        else {
          std::__cxx11::string::clear();
          res->status = 0x1a0;
        }
        std::__cxx11::string::~string((string *)&compressor);
      }
    }
    if (EVar2 != None) {
      std::unique_ptr<httplib::detail::compressor,std::default_delete<httplib::detail::compressor>>
      ::unique_ptr<std::default_delete<httplib::detail::compressor>,void>
                ((unique_ptr<httplib::detail::compressor,std::default_delete<httplib::detail::compressor>>
                  *)(content_encoding.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(compressed.field_2._M_local_buf + 8));
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)(content_encoding.field_2._M_local_buf + 8));
      if (bVar1) {
        std::__cxx11::string::string((string *)local_388);
        pcVar8 = std::
                 unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
                 ::operator->((unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
                               *)((long)&content_encoding.field_2 + 8));
        uVar9 = std::__cxx11::string::data();
        uVar10 = std::__cxx11::string::size();
        local_3b0.compressed = (string *)local_388;
        std::function<bool(char_const*,unsigned_long)>::
        function<httplib::Server::apply_ranges(httplib::Request_const&,httplib::Response&,std::__cxx11::string&,std::__cxx11::string&)::_lambda(char_const*,unsigned_long)_1_,void>
                  ((function<bool(char_const*,unsigned_long)> *)&local_3a8,&local_3b0);
        uVar3 = (*pcVar8->_vptr_compressor[2])(pcVar8,uVar9,uVar10,1,&local_3a8);
        std::function<bool_(const_char_*,_unsigned_long)>::~function(&local_3a8);
        if ((uVar3 & 1) != 0) {
          std::__cxx11::string::swap((string *)&res->body);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_3d0,"Content-Encoding",
                     (allocator *)(length_1.field_2._M_local_buf + 0xf));
          Response::set_header(res,&local_3d0,(string *)((long)&compressed.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator((allocator<char> *)(length_1.field_2._M_local_buf + 0xf))
          ;
        }
        std::__cxx11::string::~string((string *)local_388);
      }
      std::__cxx11::string::~string((string *)(compressed.field_2._M_local_buf + 8));
      std::
      unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>::
      ~unique_ptr((unique_ptr<httplib::detail::compressor,_std::default_delete<httplib::detail::compressor>_>
                   *)((long)&content_encoding.field_2 + 8));
    }
    __val = std::__cxx11::string::size();
    std::__cxx11::to_string((string *)local_3f8,__val);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_418,"Content-Length",&local_419);
    Response::set_header(res,&local_418,(string *)local_3f8);
    std::__cxx11::string::~string((string *)&local_418);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    std::__cxx11::string::~string((string *)local_3f8);
  }
  else if (res->content_length_ == 0) {
    bVar1 = std::function::operator_cast_to_bool((function *)&res->content_provider_);
    if ((bVar1) && ((res->is_chunked_content_provider_ & 1U) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c8,"Transfer-Encoding",&local_1c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1f0,"chunked",&local_1f1);
      Response::set_header(res,&local_1c8,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      if (EVar2 == Gzip) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_218,"Content-Encoding",&local_219);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_240,"gzip",&local_241);
        Response::set_header(res,&local_218,&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        std::allocator<char>::~allocator((allocator<char> *)&local_241);
        std::__cxx11::string::~string((string *)&local_218);
        std::allocator<char>::~allocator((allocator<char> *)&local_219);
      }
      else if (EVar2 == Brotli) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_268,"Content-Encoding",&local_269);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_290,"br",(allocator *)((long)&offsets_1.second + 7));
        Response::set_header(res,&local_268,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::allocator<char>::~allocator((allocator<char> *)((long)&offsets_1.second + 7));
        std::__cxx11::string::~string((string *)&local_268);
        std::allocator<char>::~allocator((allocator<char> *)&local_269);
      }
    }
  }
  else {
    bVar1 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::empty
                      (&req->ranges);
    if (bVar1) {
      offsets.second = res->content_length_;
    }
    else {
      sVar4 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                        (&req->ranges);
      if (sVar4 == 1) {
        pVar11 = detail::get_range_offset_and_length(req,res->content_length_,0);
        offset = pVar11.first;
        content_range.field_2._8_8_ = offset;
        offsets.first = pVar11.second;
        offsets.second = offsets.first;
        detail::make_content_range_header_field_abi_cxx11_
                  ((string *)local_138,(detail *)offset,offsets.first,res->content_length_,
                   (size_t)content_length);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_158,"Content-Range",&local_159);
        Response::set_header(res,&local_158,(string *)local_138);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        std::__cxx11::string::~string((string *)local_138);
      }
      else {
        offsets.second = detail::get_multipart_ranges_data_length(req,res,boundary,content_type);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,"Content-Length",&local_181);
    std::__cxx11::to_string(&local_1a8,offsets.second);
    Response::set_header(res,&local_180,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
  }
  return;
}

Assistant:

inline void Server::apply_ranges(const Request &req, Response &res,
                                 std::string &content_type,
                                 std::string &boundary) {
  if (req.ranges.size() > 1) {
    boundary = detail::make_multipart_data_boundary();

    auto it = res.headers.find("Content-Type");
    if (it != res.headers.end()) {
      content_type = it->second;
      res.headers.erase(it);
    }

    res.set_header("Content-Type",
                   "multipart/byteranges; boundary=" + boundary);
  }

  auto type = detail::encoding_type(req, res);

  if (res.body.empty()) {
    if (res.content_length_ > 0) {
      size_t length = 0;
      if (req.ranges.empty()) {
        length = res.content_length_;
      } else if (req.ranges.size() == 1) {
        auto offsets =
            detail::get_range_offset_and_length(req, res.content_length_, 0);
        auto offset = offsets.first;
        length = offsets.second;
        auto content_range = detail::make_content_range_header_field(
            offset, length, res.content_length_);
        res.set_header("Content-Range", content_range);
      } else {
        length = detail::get_multipart_ranges_data_length(req, res, boundary,
                                                          content_type);
      }
      res.set_header("Content-Length", std::to_string(length));
    } else {
      if (res.content_provider_) {
        if (res.is_chunked_content_provider_) {
          res.set_header("Transfer-Encoding", "chunked");
          if (type == detail::EncodingType::Gzip) {
            res.set_header("Content-Encoding", "gzip");
          } else if (type == detail::EncodingType::Brotli) {
            res.set_header("Content-Encoding", "br");
          }
        }
      }
    }
  } else {
    if (req.ranges.empty()) {
      ;
    } else if (req.ranges.size() == 1) {
      auto offsets =
          detail::get_range_offset_and_length(req, res.body.size(), 0);
      auto offset = offsets.first;
      auto length = offsets.second;
      auto content_range = detail::make_content_range_header_field(
          offset, length, res.body.size());
      res.set_header("Content-Range", content_range);
      if (offset < res.body.size()) {
        res.body = res.body.substr(offset, length);
      } else {
        res.body.clear();
        res.status = 416;
      }
    } else {
      std::string data;
      if (detail::make_multipart_ranges_data(req, res, boundary, content_type,
                                             data)) {
        res.body.swap(data);
      } else {
        res.body.clear();
        res.status = 416;
      }
    }

    if (type != detail::EncodingType::None) {
      std::unique_ptr<detail::compressor> compressor;
      std::string content_encoding;

      if (type == detail::EncodingType::Gzip) {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
        compressor = detail::make_unique<detail::gzip_compressor>();
        content_encoding = "gzip";
#endif
      } else if (type == detail::EncodingType::Brotli) {
#ifdef CPPHTTPLIB_BROTLI_SUPPORT
        compressor = detail::make_unique<detail::brotli_compressor>();
        content_encoding = "br";
#endif
      }

      if (compressor) {
        std::string compressed;
        if (compressor->compress(res.body.data(), res.body.size(), true,
                                 [&](const char *data, size_t data_len) {
                                   compressed.append(data, data_len);
                                   return true;
                                 })) {
          res.body.swap(compressed);
          res.set_header("Content-Encoding", content_encoding);
        }
      }
    }

    auto length = std::to_string(res.body.size());
    res.set_header("Content-Length", length);
  }
}